

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::GcAwakeTransientWindowBuffers(ImGuiWindow *window)

{
  int *piVar1;
  int iVar2;
  ImDrawList *pIVar3;
  unsigned_short *puVar4;
  ImDrawVert *pIVar5;
  unsigned_short *__dest;
  ImDrawVert *__dest_00;
  
  window->MemoryCompacted = false;
  pIVar3 = window->DrawList;
  iVar2 = window->MemoryDrawListIdxCapacity;
  if ((pIVar3->IdxBuffer).Capacity < iVar2) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (unsigned_short *)(*GImAllocatorAllocFunc)((long)iVar2 * 2,GImAllocatorUserData);
    puVar4 = (pIVar3->IdxBuffer).Data;
    if (puVar4 != (unsigned_short *)0x0) {
      memcpy(__dest,puVar4,(long)(pIVar3->IdxBuffer).Size * 2);
      puVar4 = (pIVar3->IdxBuffer).Data;
      if ((puVar4 != (unsigned_short *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar4,GImAllocatorUserData);
    }
    (pIVar3->IdxBuffer).Data = __dest;
    (pIVar3->IdxBuffer).Capacity = iVar2;
  }
  pIVar3 = window->DrawList;
  iVar2 = window->MemoryDrawListVtxCapacity;
  if ((pIVar3->VtxBuffer).Capacity < iVar2) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest_00 = (ImDrawVert *)(*GImAllocatorAllocFunc)((long)iVar2 * 0x14,GImAllocatorUserData);
    pIVar5 = (pIVar3->VtxBuffer).Data;
    if (pIVar5 != (ImDrawVert *)0x0) {
      memcpy(__dest_00,pIVar5,(long)(pIVar3->VtxBuffer).Size * 0x14);
      pIVar5 = (pIVar3->VtxBuffer).Data;
      if ((pIVar5 != (ImDrawVert *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar5,GImAllocatorUserData);
    }
    (pIVar3->VtxBuffer).Data = __dest_00;
    (pIVar3->VtxBuffer).Capacity = iVar2;
  }
  window->MemoryDrawListIdxCapacity = 0;
  window->MemoryDrawListVtxCapacity = 0;
  return;
}

Assistant:

void ImGui::GcAwakeTransientWindowBuffers(ImGuiWindow* window)
{
    // We stored capacity of the ImDrawList buffer to reduce growth-caused allocation/copy when awakening.
    // The other buffers tends to amortize much faster.
    window->MemoryCompacted = false;
    window->DrawList->IdxBuffer.reserve(window->MemoryDrawListIdxCapacity);
    window->DrawList->VtxBuffer.reserve(window->MemoryDrawListVtxCapacity);
    window->MemoryDrawListIdxCapacity = window->MemoryDrawListVtxCapacity = 0;
}